

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Nonlin.c
# Opt level: O3

void Llb_MnnStop(Llb_Mnn_t *p)

{
  DdNode *n;
  void **ppvVar1;
  long lVar2;
  int level;
  DdManager *pDVar3;
  Vec_Int_t *pVVar4;
  Vec_Ptr_t *pVVar5;
  double dVar6;
  double dVar7;
  
  if (p->pPars->fVerbose != 0) {
    pDVar3 = p->ddG;
    p->timeOther = p->timeTotal - (p->timeImage + p->timeTran1 + p->timeTran2 + p->timeGloba);
    lVar2 = Cudd_ReadReorderingTime(pDVar3);
    p->timeReoG = lVar2;
    level = (int)pDVar3;
    Abc_Print(level,"%s =","Image    ");
    dVar6 = 0.0;
    if (p->timeTotal != 0) {
      dVar6 = ((double)p->timeImage * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeImage / 1000000.0,dVar6);
    Abc_Print(level,"%s =","  build  ");
    dVar6 = 0.0;
    if (p->timeTotal != 0) {
      dVar6 = ((double)timeBuild * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)timeBuild / 1000000.0,dVar6);
    Abc_Print(level,"%s =","  and-ex ");
    dVar6 = 0.0;
    if (p->timeTotal != 0) {
      dVar6 = ((double)timeAndEx * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)timeAndEx / 1000000.0,dVar6);
    Abc_Print(level,"%s =","  other  ");
    dVar6 = 0.0;
    if (p->timeTotal != 0) {
      dVar6 = ((double)timeOther * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)timeOther / 1000000.0,dVar6);
    Abc_Print(level,"%s =","Transfer1");
    dVar6 = 0.0;
    if (p->timeTotal != 0) {
      dVar6 = ((double)p->timeTran1 * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeTran1 / 1000000.0,dVar6);
    Abc_Print(level,"%s =","Transfer2");
    dVar6 = 0.0;
    if (p->timeTotal != 0) {
      dVar6 = ((double)p->timeTran2 * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeTran2 / 1000000.0,dVar6);
    Abc_Print(level,"%s =","Global   ");
    dVar6 = 0.0;
    if (p->timeTotal != 0) {
      dVar6 = ((double)p->timeGloba * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeGloba / 1000000.0,dVar6);
    Abc_Print(level,"%s =","Other    ");
    dVar6 = 0.0;
    if (p->timeTotal != 0) {
      dVar6 = ((double)p->timeOther * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeOther / 1000000.0,dVar6);
    Abc_Print(level,"%s =","TOTAL    ");
    dVar7 = (double)p->timeTotal;
    dVar6 = 0.0;
    if (p->timeTotal != 0) {
      dVar6 = (dVar7 * 100.0) / dVar7;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",dVar7 / 1000000.0,dVar6);
    Abc_Print(level,"%s =","  reo    ");
    dVar6 = 0.0;
    if (p->timeTotal != 0) {
      dVar6 = ((double)p->timeReo * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeReo / 1000000.0,dVar6);
    Abc_Print(level,"%s =","  reoG   ");
    dVar6 = 0.0;
    if (p->timeTotal != 0) {
      dVar6 = ((double)p->timeReoG * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeReoG / 1000000.0,dVar6);
  }
  n = p->ddR->bFunc;
  if (n != (DdNode *)0x0) {
    Cudd_RecursiveDeref(p->ddR,n);
  }
  pVVar5 = p->vRings;
  if (0 < pVVar5->nSize) {
    lVar2 = 0;
    do {
      Cudd_RecursiveDeref(p->ddR,(DdNode *)pVVar5->pArray[lVar2]);
      lVar2 = lVar2 + 1;
      pVVar5 = p->vRings;
    } while (lVar2 < pVVar5->nSize);
  }
  if (pVVar5->pArray != (void **)0x0) {
    free(pVVar5->pArray);
  }
  free(pVVar5);
  pDVar3 = p->ddG;
  if (pDVar3->bFunc != (DdNode *)0x0) {
    Cudd_RecursiveDeref(pDVar3,pDVar3->bFunc);
    pDVar3 = p->ddG;
  }
  if (pDVar3->bFunc2 != (DdNode *)0x0) {
    Cudd_RecursiveDeref(pDVar3,pDVar3->bFunc2);
    pDVar3 = p->ddG;
  }
  Extra_StopManager(pDVar3);
  Extra_StopManager(p->ddR);
  pVVar4 = p->vCs2Glo;
  if (pVVar4 != (Vec_Int_t *)0x0) {
    if (pVVar4->pArray != (int *)0x0) {
      free(pVVar4->pArray);
      p->vCs2Glo->pArray = (int *)0x0;
      pVVar4 = p->vCs2Glo;
      if (pVVar4 == (Vec_Int_t *)0x0) goto LAB_00844462;
    }
    free(pVVar4);
    p->vCs2Glo = (Vec_Int_t *)0x0;
  }
LAB_00844462:
  pVVar4 = p->vNs2Glo;
  if (pVVar4 != (Vec_Int_t *)0x0) {
    if (pVVar4->pArray != (int *)0x0) {
      free(pVVar4->pArray);
      p->vNs2Glo->pArray = (int *)0x0;
      pVVar4 = p->vNs2Glo;
      if (pVVar4 == (Vec_Int_t *)0x0) goto LAB_0084449e;
    }
    free(pVVar4);
    p->vNs2Glo = (Vec_Int_t *)0x0;
  }
LAB_0084449e:
  pVVar4 = p->vGlo2Cs;
  if (pVVar4 != (Vec_Int_t *)0x0) {
    if (pVVar4->pArray != (int *)0x0) {
      free(pVVar4->pArray);
      p->vGlo2Cs->pArray = (int *)0x0;
      pVVar4 = p->vGlo2Cs;
      if (pVVar4 == (Vec_Int_t *)0x0) goto LAB_008444da;
    }
    free(pVVar4);
    p->vGlo2Cs = (Vec_Int_t *)0x0;
  }
LAB_008444da:
  pVVar4 = p->vGlo2Ns;
  if (pVVar4 != (Vec_Int_t *)0x0) {
    if (pVVar4->pArray != (int *)0x0) {
      free(pVVar4->pArray);
      p->vGlo2Ns->pArray = (int *)0x0;
      pVVar4 = p->vGlo2Ns;
      if (pVVar4 == (Vec_Int_t *)0x0) goto LAB_00844522;
    }
    free(pVVar4);
    p->vGlo2Ns = (Vec_Int_t *)0x0;
  }
LAB_00844522:
  pVVar5 = p->vLeaves;
  ppvVar1 = pVVar5->pArray;
  if (ppvVar1 != (void **)0x0) {
    free(ppvVar1);
  }
  free(pVVar5);
  pVVar5 = p->vRoots;
  ppvVar1 = pVVar5->pArray;
  if (ppvVar1 != (void **)0x0) {
    free(ppvVar1);
  }
  free(pVVar5);
  if (p->pVars2Q != (int *)0x0) {
    free(p->pVars2Q);
    p->pVars2Q = (int *)0x0;
  }
  if (p->pOrderL != (int *)0x0) {
    free(p->pOrderL);
    p->pOrderL = (int *)0x0;
  }
  if (p->pOrderL2 != (int *)0x0) {
    free(p->pOrderL2);
    p->pOrderL2 = (int *)0x0;
  }
  if (p->pOrderG != (int *)0x0) {
    free(p->pOrderG);
  }
  free(p);
  return;
}

Assistant:

void Llb_MnnStop( Llb_Mnn_t * p )
{
    DdNode * bTemp;
    int i;
    if ( p->pPars->fVerbose ) 
    {
        p->timeOther = p->timeTotal - p->timeImage - p->timeTran1 - p->timeTran2 - p->timeGloba;
        p->timeReoG  = Cudd_ReadReorderingTime(p->ddG);
        ABC_PRTP( "Image    ", p->timeImage, p->timeTotal );
        ABC_PRTP( "  build  ",    timeBuild, p->timeTotal );
        ABC_PRTP( "  and-ex ",    timeAndEx, p->timeTotal );
        ABC_PRTP( "  other  ",    timeOther, p->timeTotal );
        ABC_PRTP( "Transfer1", p->timeTran1, p->timeTotal );
        ABC_PRTP( "Transfer2", p->timeTran2, p->timeTotal );
        ABC_PRTP( "Global   ", p->timeGloba, p->timeTotal );
        ABC_PRTP( "Other    ", p->timeOther, p->timeTotal );
        ABC_PRTP( "TOTAL    ", p->timeTotal, p->timeTotal );
        ABC_PRTP( "  reo    ", p->timeReo,   p->timeTotal );
        ABC_PRTP( "  reoG   ", p->timeReoG,  p->timeTotal );
    }
    if ( p->ddR->bFunc )
        Cudd_RecursiveDeref( p->ddR, p->ddR->bFunc );
    Vec_PtrForEachEntry( DdNode *, p->vRings, bTemp, i )
        Cudd_RecursiveDeref( p->ddR, bTemp );
    Vec_PtrFree( p->vRings );
    if ( p->ddG->bFunc )
        Cudd_RecursiveDeref( p->ddG, p->ddG->bFunc );
    if ( p->ddG->bFunc2 )
        Cudd_RecursiveDeref( p->ddG, p->ddG->bFunc2 );
//    printf( "manager1\n" );
//    Extra_StopManager( p->dd );
//    printf( "manager2\n" );
    Extra_StopManager( p->ddG );
//    printf( "manager3\n" );
    Extra_StopManager( p->ddR );
    Vec_IntFreeP( &p->vCs2Glo );
    Vec_IntFreeP( &p->vNs2Glo );
    Vec_IntFreeP( &p->vGlo2Cs );
    Vec_IntFreeP( &p->vGlo2Ns );
    Vec_PtrFree( p->vLeaves );
    Vec_PtrFree( p->vRoots );
    ABC_FREE( p->pVars2Q );
    ABC_FREE( p->pOrderL );
    ABC_FREE( p->pOrderL2 );
    ABC_FREE( p->pOrderG );
    ABC_FREE( p );
}